

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

SimplePragmaExpressionSyntax * __thiscall
slang::BumpAllocator::emplace<slang::syntax::SimplePragmaExpressionSyntax,slang::parsing::Token>
          (BumpAllocator *this,Token *args)

{
  Token value;
  SimplePragmaExpressionSyntax *pSVar1;
  Info *in_RSI;
  BumpAllocator *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  pSVar1 = (SimplePragmaExpressionSyntax *)allocate(in_RDI,(size_t)in_RSI,in_stack_ffffffffffffffe8)
  ;
  value.info = in_RSI;
  value._0_8_ = in_RSI->location;
  slang::syntax::SimplePragmaExpressionSyntax::SimplePragmaExpressionSyntax
            ((SimplePragmaExpressionSyntax *)in_RSI->rawTextPtr,value);
  return pSVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }